

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncat.c
# Opt level: O2

char * strncat(char *__dest,char *__src,size_t __n)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *rc;
  size_t sVar4;
  
  pcVar2 = __dest;
  do {
    pcVar3 = pcVar2;
    pcVar2 = pcVar3 + 1;
  } while (*pcVar3 != '\0');
  sVar4 = 0;
  while( true ) {
    if (__n == sVar4) {
      pcVar3[sVar4] = '\0';
      return __dest;
    }
    cVar1 = __src[sVar4];
    pcVar3[sVar4] = cVar1;
    if (cVar1 == '\0') break;
    sVar4 = sVar4 + 1;
  }
  return __dest;
}

Assistant:

char * strncat( char * _PDCLIB_restrict s1, const char * _PDCLIB_restrict s2, size_t n )
{
    char * rc = s1;

    while ( *s1 )
    {
        ++s1;
    }

    while ( n && ( *s1++ = *s2++ ) )
    {
        --n;
    }

    if ( n == 0 )
    {
        *s1 = '\0';
    }

    return rc;
}